

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall
olc::Platform_Linux::CreateGraphics
          (Platform_Linux *this,bool bFullScreen,bool bEnableVSYNC,vi2d *vViewPos,vi2d *vViewSize)

{
  initializer_list<void_*> __l;
  int iVar1;
  pointer pRVar2;
  allocator<void_*> local_71;
  Display *local_70;
  Window *local_68;
  XVisualInfo *local_60;
  Display **local_58;
  size_type local_50;
  vector<void_*,_std::allocator<void_*>_> local_48;
  vi2d *local_30;
  vi2d *vViewSize_local;
  vi2d *vViewPos_local;
  bool bEnableVSYNC_local;
  Platform_Linux *pPStack_18;
  bool bFullScreen_local;
  Platform_Linux *this_local;
  
  local_30 = vViewSize;
  vViewSize_local = vViewPos;
  vViewPos_local._6_1_ = bEnableVSYNC;
  vViewPos_local._7_1_ = bFullScreen;
  pPStack_18 = this;
  pRVar2 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                     ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  local_70 = this->olc_Display;
  local_68 = &this->olc_Window;
  local_60 = this->olc_VisualInfo;
  local_58 = &local_70;
  local_50 = 3;
  std::allocator<void_*>::allocator(&local_71);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<void_*,_std::allocator<void_*>_>::vector(&local_48,__l,&local_71);
  iVar1 = (*pRVar2->_vptr_Renderer[3])
                    (pRVar2,&local_48,(ulong)(vViewPos_local._7_1_ & 1),
                     (ulong)(vViewPos_local._6_1_ & 1));
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&local_48);
  std::allocator<void_*>::~allocator(&local_71);
  if (iVar1 == 1) {
    pRVar2 = std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
                       ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer)
    ;
    (*pRVar2->_vptr_Renderer[0xf])(pRVar2,vViewSize_local,local_30);
  }
  this_local._4_4_ = (rcode)(iVar1 == 1);
  return this_local._4_4_;
}

Assistant:

virtual olc::rcode CreateGraphics(bool bFullScreen, bool bEnableVSYNC, const olc::vi2d &vViewPos, const olc::vi2d &vViewSize) override
		{
			if (renderer->CreateDevice({olc_Display, &olc_Window, olc_VisualInfo}, bFullScreen, bEnableVSYNC) == olc::rcode::OK)
			{
				renderer->UpdateViewport(vViewPos, vViewSize);
				return olc::rcode::OK;
			}
			else
				return olc::rcode::FAIL;
		}